

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O2

void update_loss_alarm(quicly_conn_t *conn,int is_after_send)

{
  long lVar1;
  long lVar2;
  quicly_loss_conf_t *pqVar3;
  int iVar4;
  uint32_t uVar5;
  byte bVar6;
  uint uVar7;
  uint uVar8;
  long lVar9;
  ulong uVar10;
  bool bVar11;
  bool bVar12;
  long lStack_40;
  
  if ((conn->egress).loss.sentmap.bytes_in_flight == 0) {
    bVar11 = ((uint)(conn->super).remote.address_validation & 2) == 0;
  }
  else {
    bVar11 = false;
  }
  if (conn->initial == (st_quicly_handshake_space_t *)0x0) {
    bVar12 = conn->handshake != (st_quicly_handshake_space_t *)0x0;
  }
  else {
    bVar12 = true;
  }
  lVar9 = 0x7fffffffffffffff;
  lVar1 = (conn->stash).now;
  lVar2 = (conn->egress).last_retransmittable_sent_at;
  iVar4 = scheduler_can_send(conn);
  if (bVar11) {
    (conn->egress).loss.alarm_at = 0x7fffffffffffffff;
    lStack_40 = 0x50;
  }
  else {
    if (lVar2 == 0x7fffffffffffffff) {
      __assert_fail("last_retransmittable_sent_at != INT64_MAX",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/include/quicly/loss.h"
                    ,0x101,
                    "void quicly_loss_update_alarm(quicly_loss_t *, int64_t, int64_t, int, int, int, uint64_t, int)"
                   );
    }
    lVar9 = (conn->egress).loss.loss_time;
    if (lVar9 == 0x7fffffffffffffff) {
      bVar6 = (conn->egress).loss.pto_count;
      if ('>' < (char)bVar6) {
        __assert_fail("r->pto_count < 63",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/include/quicly/loss.h"
                      ,0x116,
                      "void quicly_loss_update_alarm(quicly_loss_t *, int64_t, int64_t, int, int, int, uint64_t, int)"
                     );
      }
      pqVar3 = (conn->egress).loss.conf;
      if (((pqVar3->num_speculative_ptos != '\0') &&
          ((iVar4 == 0 && !bVar12) && (char)bVar6 < '\x01')) &&
         (uVar10 = (conn->egress).max_data.sent, (conn->egress).loss.total_bytes_sent < uVar10)) {
        if (bVar6 == 0) {
          bVar6 = -pqVar3->num_speculative_ptos;
          (conn->egress).loss.pto_count = bVar6;
        }
        (conn->egress).loss.total_bytes_sent = uVar10;
      }
      if ((char)bVar6 < '\0') {
        uVar7 = pqVar3->min_pto;
        uVar5 = (conn->egress).loss.rtt.variance;
        uVar8 = uVar5 * 4;
        if (uVar5 == 0) {
          uVar8 = uVar7;
        }
        uVar10 = (ulong)(uVar8 + (conn->egress).loss.rtt.smoothed >> (-bVar6 & 0x3f));
        if (uVar10 <= uVar7) {
          uVar10 = (ulong)uVar7;
        }
      }
      else {
        uVar7 = 0;
        if (!bVar12) {
          uVar7 = (uint)*(conn->egress).loss.max_ack_delay;
        }
        uVar5 = (conn->egress).loss.rtt.variance;
        if (uVar5 == 0) {
          uVar5 = pqVar3->min_pto;
        }
        else {
          uVar5 = uVar5 << 2;
        }
        uVar10 = (ulong)(uVar7 + (conn->egress).loss.rtt.smoothed + uVar5) << (bVar6 & 0x3f);
      }
      lVar9 = uVar10 + lVar2;
      if (is_after_send == 0) {
        if (lVar9 <= lVar1) {
          lVar9 = lVar1;
        }
      }
      else if (lVar9 <= lVar1) {
        __assert_fail("now < _t",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/include/quicly/loss.h"
                      ,0x138,
                      "void quicly_loss_update_alarm(quicly_loss_t *, int64_t, int64_t, int, int, int, uint64_t, int)"
                     );
      }
      lStack_40 = 0x58;
    }
    else if (is_after_send == 0) {
      if (lVar1 < lVar9) {
        lVar1 = lVar9;
      }
      lVar9 = lVar1;
      lStack_40 = 0x58;
    }
    else {
      if (lVar9 <= lVar1) {
        __assert_fail("now < _t",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/include/quicly/loss.h"
                      ,0x110,
                      "void quicly_loss_update_alarm(quicly_loss_t *, int64_t, int64_t, int, int, int, uint64_t, int)"
                     );
      }
      lStack_40 = 0x58;
    }
  }
  *(long *)((long)(conn->egress).loss.largest_acked_packet_plus1 + lStack_40 + -0x28) = lVar9;
  return;
}

Assistant:

static void update_loss_alarm(quicly_conn_t *conn, int is_after_send)
{
    int has_outstanding = conn->egress.loss.sentmap.bytes_in_flight != 0 || conn->super.remote.address_validation.send_probe,
        handshake_is_in_progress = conn->initial != NULL || conn->handshake != NULL;
    quicly_loss_update_alarm(&conn->egress.loss, conn->stash.now, conn->egress.last_retransmittable_sent_at, has_outstanding,
                             scheduler_can_send(conn), handshake_is_in_progress, conn->egress.max_data.sent, is_after_send);
}